

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_rtp_readwrite(Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *readmore)

{
  uint uVar1;
  CURLcode CVar2;
  anon_union_224_10_26c073a1_for_proto *paVar3;
  void *pvVar4;
  bool bVar5;
  int rtp_length;
  char *newptr;
  CURLcode result;
  char *scratch;
  ssize_t rtp_dataleft;
  char *rtp;
  rtsp_conn *rtspc;
  SingleRequest *k;
  _Bool *readmore_local;
  ssize_t *nread_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  paVar3 = &conn->proto;
  if ((paVar3->ftpc).pp.cache == (char *)0x0) {
    rtp_dataleft = (ssize_t)(data->req).str;
    scratch = (char *)*nread;
  }
  else {
    pvVar4 = Curl_saferealloc(paVar3->generic,(conn->proto).ftpc.pp.cache_size + *nread);
    if (pvVar4 == (void *)0x0) {
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    paVar3->generic = pvVar4;
    memcpy((paVar3->ftpc).pp.cache + (conn->proto).ftpc.pp.cache_size,(data->req).str,*nread);
    (conn->proto).ftpc.pp.cache_size = *nread + (conn->proto).ftpc.pp.cache_size;
    rtp_dataleft = (ssize_t)(paVar3->ftpc).pp.cache;
    scratch = (char *)(conn->proto).ftpc.pp.cache_size;
  }
  while( true ) {
    bVar5 = false;
    if (0 < (long)scratch) {
      bVar5 = *(char *)rtp_dataleft == '$';
    }
    if (!bVar5) break;
    if ((long)scratch < 5) {
      *readmore = true;
      break;
    }
    *(uint *)((long)&conn->proto + 0x10) = (uint)*(byte *)(rtp_dataleft + 1);
    uVar1 = (uint)CONCAT11(*(undefined1 *)(rtp_dataleft + 2),*(undefined1 *)(rtp_dataleft + 3));
    if ((long)scratch < (long)(int)(uVar1 + 4)) {
      *readmore = true;
      break;
    }
    CVar2 = rtp_client_write(conn,(char *)rtp_dataleft,(long)(int)(uVar1 + 4));
    if (CVar2 != CURLE_OK) {
      Curl_failf(data,"Got an error writing an RTP packet");
      *readmore = false;
      (*Curl_cfree)((paVar3->ftpc).pp.cache);
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CVar2;
    }
    scratch = scratch + -(long)(int)(uVar1 + 4);
    rtp_dataleft = rtp_dataleft + (int)(uVar1 + 4);
    if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
      (data->req).keepon = (data->req).keepon & 0xfffffffe;
    }
  }
  if ((scratch != (char *)0x0) && (*(char *)rtp_dataleft == '$')) {
    pvVar4 = (*Curl_cmalloc)((size_t)scratch);
    if (pvVar4 == (void *)0x0) {
      (*Curl_cfree)((paVar3->ftpc).pp.cache);
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pvVar4,(void *)rtp_dataleft,(size_t)scratch);
    (*Curl_cfree)((paVar3->ftpc).pp.cache);
    (paVar3->ftpc).pp.cache = (char *)0x0;
    paVar3->generic = pvVar4;
    (conn->proto).ftpc.pp.cache_size = (size_t)scratch;
    *nread = 0;
    return CURLE_OK;
  }
  (data->req).str = (data->req).str + (*nread - (long)scratch);
  *nread = (ssize_t)scratch;
  (*Curl_cfree)((paVar3->ftpc).pp.cache);
  (paVar3->ftpc).pp.cache = (char *)0x0;
  (paVar3->ftpc).pp.cache = (char *)0x0;
  (conn->proto).ftpc.pp.cache_size = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode rtsp_rtp_readwrite(struct Curl_easy *data,
                                   struct connectdata *conn,
                                   ssize_t *nread,
                                   bool *readmore) {
  struct SingleRequest *k = &data->req;
  struct rtsp_conn *rtspc = &(conn->proto.rtspc);

  char *rtp; /* moving pointer to rtp data */
  ssize_t rtp_dataleft; /* how much data left to parse in this round */
  char *scratch;
  CURLcode result;

  if(rtspc->rtp_buf) {
    /* There was some leftover data the last time. Merge buffers */
    char *newptr = Curl_saferealloc(rtspc->rtp_buf,
                                    rtspc->rtp_bufsize + *nread);
    if(!newptr) {
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    rtspc->rtp_buf = newptr;
    memcpy(rtspc->rtp_buf + rtspc->rtp_bufsize, k->str, *nread);
    rtspc->rtp_bufsize += *nread;
    rtp = rtspc->rtp_buf;
    rtp_dataleft = rtspc->rtp_bufsize;
  }
  else {
    /* Just parse the request buffer directly */
    rtp = k->str;
    rtp_dataleft = *nread;
  }

  while((rtp_dataleft > 0) &&
        (rtp[0] == '$')) {
    if(rtp_dataleft > 4) {
      int rtp_length;

      /* Parse the header */
      /* The channel identifier immediately follows and is 1 byte */
      rtspc->rtp_channel = RTP_PKT_CHANNEL(rtp);

      /* The length is two bytes */
      rtp_length = RTP_PKT_LENGTH(rtp);

      if(rtp_dataleft < rtp_length + 4) {
        /* Need more - incomplete payload*/
        *readmore = TRUE;
        break;
      }
      else {
        /* We have the full RTP interleaved packet
         * Write out the header including the leading '$' */
        DEBUGF(infof(data, "RTP write channel %d rtp_length %d\n",
              rtspc->rtp_channel, rtp_length));
        result = rtp_client_write(conn, &rtp[0], rtp_length + 4);
        if(result) {
          failf(data, "Got an error writing an RTP packet");
          *readmore = FALSE;
          Curl_safefree(rtspc->rtp_buf);
          rtspc->rtp_buf = NULL;
          rtspc->rtp_bufsize = 0;
          return result;
        }

        /* Move forward in the buffer */
        rtp_dataleft -= rtp_length + 4;
        rtp += rtp_length + 4;

        if(data->set.rtspreq == RTSPREQ_RECEIVE) {
          /* If we are in a passive receive, give control back
           * to the app as often as we can.
           */
          k->keepon &= ~KEEP_RECV;
        }
      }
    }
    else {
      /* Need more - incomplete header */
      *readmore = TRUE;
      break;
    }
  }

  if(rtp_dataleft != 0 && rtp[0] == '$') {
    DEBUGF(infof(data, "RTP Rewinding %zd %s\n", rtp_dataleft,
          *readmore ? "(READMORE)" : ""));

    /* Store the incomplete RTP packet for a "rewind" */
    scratch = malloc(rtp_dataleft);
    if(!scratch) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(scratch, rtp, rtp_dataleft);
    Curl_safefree(rtspc->rtp_buf);
    rtspc->rtp_buf = scratch;
    rtspc->rtp_bufsize = rtp_dataleft;

    /* As far as the transfer is concerned, this data is consumed */
    *nread = 0;
    return CURLE_OK;
  }
  else {
    /* Fix up k->str to point just after the last RTP packet */
    k->str += *nread - rtp_dataleft;

    /* either all of the data has been read or...
     * rtp now points at the next byte to parse
     */
    if(rtp_dataleft > 0)
      DEBUGASSERT(k->str[0] == rtp[0]);

    DEBUGASSERT(rtp_dataleft <= *nread); /* sanity check */

    *nread = rtp_dataleft;
  }

  /* If we get here, we have finished with the leftover/merge buffer */
  Curl_safefree(rtspc->rtp_buf);
  rtspc->rtp_buf = NULL;
  rtspc->rtp_bufsize = 0;

  return CURLE_OK;
}